

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-lejp.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  ssize_t sVar2;
  int iVar3;
  char buf [128];
  lejp_ctx ctx;
  uchar auStack_318 [128];
  lejp_ctx local_298;
  
  lws_set_log_level(7,(_func_void_int_char_ptr *)0x0);
  _lws_log(4,"libwebsockets-test-lejp  (C) 2017 - 2018 andy@warmcat.com\n");
  _lws_log(4,"  usage: cat my.json | libwebsockets-test-lejp\n\n");
  lejp_construct(&local_298,cb,(void *)0x0,tok,'\x01');
  do {
    sVar2 = read(0,auStack_318,0x80);
    if ((int)sVar2 < 1) {
      iVar3 = 0;
      _lws_log(4,"okay\n");
      goto LAB_001034d7;
    }
    uVar1 = lejp_parse(&local_298,auStack_318,(int)sVar2);
  } while (-2 < (int)uVar1);
  iVar3 = 1;
  _lws_log(1,"parse failed %d\n",(ulong)uVar1);
LAB_001034d7:
  lejp_destruct(&local_298);
  return iVar3;
}

Assistant:

int
main(int argc, char *argv[])
{
	int fd, n = 1, ret = 1, m;
	struct lejp_ctx ctx;
	char buf[128];

	lws_set_log_level(7, NULL);

	lwsl_notice("libwebsockets-test-lejp  (C) 2017 - 2018 andy@warmcat.com\n");
	lwsl_notice("  usage: cat my.json | libwebsockets-test-lejp\n\n");

	lejp_construct(&ctx, cb, NULL, tok, LWS_ARRAY_SIZE(tok));

	fd = 0;

	while (n > 0) {
		n = read(fd, buf, sizeof(buf));
		if (n <= 0)
			continue;

		m = lejp_parse(&ctx, (uint8_t *)buf, n);
		if (m < 0 && m != LEJP_CONTINUE) {
			lwsl_err("parse failed %d\n", m);
			goto bail;
		}
	}
	lwsl_notice("okay\n");
	ret = 0;
bail:
	lejp_destruct(&ctx);

	return ret;
}